

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estimatedplane.cc
# Opt level: O2

void __thiscall
gmath::EstimatedPlane::EstimatedPlane(EstimatedPlane *this,Vector3d *p0,Vector3d *p1,Vector3d *p2)

{
  double dVar1;
  Vector3d N;
  Vector3d v;
  Vector3d u;
  SVector<double,_3> local_78;
  SVector<double,_3> local_58;
  SVector<double,_3> local_40;
  
  this->n = 0;
  this->sx = 0.0;
  this->sy = 0.0;
  this->sz = 0.0;
  this->sxx = 0.0;
  this->sxy = 0.0;
  this->sxz = 0.0;
  this->syy = 0.0;
  this->syz = 0.0;
  this->c = INFINITY;
  this->a = INFINITY;
  this->b = INFINITY;
  SVector<double,_3>::operator-(&local_40,p1,p0);
  SVector<double,_3>::operator-(&local_58,p2,p0);
  cross<double>(&local_78,&local_40,&local_58);
  if ((local_78.v[2] != 0.0) || (NAN(local_78.v[2]))) {
    SVector<double,_3>::operator/=(&local_78,local_78.v[2]);
    *(undefined4 *)&this->a = local_78.v[0]._0_4_;
    *(uint *)((long)&this->a + 4) = local_78.v[0]._4_4_ ^ 0x80000000;
    *(int *)&this->b = SUB84(local_78.v[1],0);
    *(uint *)((long)&this->b + 4) = (uint)((ulong)local_78.v[1] >> 0x20) ^ 0x80000000;
    dVar1 = SVector<double,_3>::operator*(p0,&local_78);
    this->c = dVar1;
  }
  return;
}

Assistant:

EstimatedPlane::EstimatedPlane(const Vector3d &p0, const Vector3d &p1, const Vector3d &p2)
{
  sx=sy=sz=0;
  sxx=sxy=sxz=syy=syz=0;
  n=0;

  a=b=c=std::numeric_limits<double>::infinity();

  Vector3d u=p1-p0;
  Vector3d v=p2-p0;
  Vector3d N=gmath::cross(u, v);

  if (fabs(N[2]) != 0)
  {
    N/=N[2];
    a=-N[0];
    b=-N[1];
    c=p0*N;
  }
}